

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseLine
          (MultipoleAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  undefined8 uVar1;
  bool isQuadrupole;
  int iVar2;
  double *pdVar3;
  char *__format;
  string *psVar4;
  double *pdVar5;
  uint k;
  string *psVar6;
  long lVar7;
  long lVar8;
  MultipoleAtomTypesSectionParser *pMVar9;
  uint j;
  long lVar10;
  uint j_3;
  double *pdVar11;
  bool isDipole;
  RealType RVar12;
  double dVar13;
  RealType dipoleMoment;
  string multipoleType;
  MultipoleAdapter ma;
  string atomTypeName;
  StringTokenizer tokenizer;
  Mat3x3d quadrupole;
  RectMatrix<double,_3U,_3U> result_1;
  SquareMatrix3<double> result;
  Vector<double,_3U> result_2;
  RealType local_350;
  RealType local_348;
  RealType local_338;
  undefined1 local_328 [32];
  Vector3d local_308;
  string local_2e8;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double local_298;
  double dStack_290;
  double local_288;
  MultipoleAdapter local_278;
  string local_270;
  StringTokenizer local_250;
  double local_1f8 [10];
  double local_1a8 [10];
  double local_158;
  double local_148;
  double local_138;
  Vector3d local_128;
  double local_108 [10];
  double local_b8 [9];
  Mat3x3d local_70;
  
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8," ;\t\n\r","");
  psVar6 = &local_2e8;
  StringTokenizer::StringTokenizer(&local_250,line,psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_250);
  if (iVar2 < 5) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    goto LAB_001eaf5a;
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_270,&local_250);
  StringTokenizer::nextToken_abi_cxx11_((string *)local_328,&local_250);
  local_338 = StringTokenizer::nextTokenAsDouble(&local_250);
  local_348 = StringTokenizer::nextTokenAsDouble(&local_250);
  RVar12 = StringTokenizer::nextTokenAsDouble(&local_250);
  local_278.at_ = ForceField::getAtomType(ff,&local_270);
  if (local_278.at_ == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Can not find matched AtomType[%s] at line %d\n"
             ,local_270._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  local_338 = (local_338 * 3.141592653589793) / 180.0;
  local_348 = (local_348 * 3.141592653589793) / 180.0;
  dVar13 = (RVar12 * 3.141592653589793) / 180.0;
  local_2a8 = 0.0;
  local_2b8 = 0.0;
  dStack_2b0 = 0.0;
  local_2c8 = 0.0;
  dStack_2c0 = 0.0;
  local_2e8.field_2._M_allocated_capacity = 0;
  local_2e8.field_2._8_8_ = 0;
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_148 = sin(local_338);
  local_138 = sin(local_348);
  local_158 = sin(dVar13);
  local_338 = cos(local_338);
  local_348 = cos(local_348);
  dStack_2c0 = cos(dVar13);
  local_2e8.field_2._M_allocated_capacity = (size_type)(local_138 * local_158);
  local_2e8._M_dataplus._M_p =
       (pointer)(dStack_2c0 * local_338 + local_158 * -local_348 * local_148);
  local_2e8._M_string_length =
       (size_type)(dStack_2c0 * local_148 + local_158 * local_348 * local_338);
  local_2e8.field_2._8_8_ = dStack_2c0 * -local_348 * local_148 - local_338 * local_158;
  local_2c8 = dStack_2c0 * local_348 * local_338 - local_148 * local_158;
  dStack_2c0 = local_138 * dStack_2c0;
  local_2b8 = local_138 * local_148;
  dStack_2b0 = -local_138 * local_338;
  local_2a8 = local_348;
  local_350 = 0.0;
  local_288 = (double)OpenMD::V3Zero._16_8_;
  local_298 = (double)OpenMD::V3Zero._0_8_;
  dStack_290 = (double)OpenMD::V3Zero._8_8_;
  local_308.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  local_308.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_308.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_1f8[8] = 0.0;
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[3] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  pMVar9 = (MultipoleAtomTypesSectionParser *)local_328;
  iVar2 = std::__cxx11::string::compare((char *)pMVar9);
  if (iVar2 == 0) {
    parseDipole(pMVar9,&local_250,&local_350,lineNo);
    isDipole = true;
    isQuadrupole = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare(local_328);
    if (iVar2 == 0) {
      __format = 
      "MultipoleAtomTypesSectionParser Error: \n\tsplit dipoles (type s) have been deprecated (line: %d)\n"
      ;
LAB_001eaaec:
      isDipole = false;
      snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
      isQuadrupole = false;
    }
    else {
      pMVar9 = (MultipoleAtomTypesSectionParser *)local_328;
      iVar2 = std::__cxx11::string::compare((char *)pMVar9);
      if (iVar2 == 0) {
        parseQuadrupole(pMVar9,&local_250,&local_308,lineNo);
        isQuadrupole = true;
        isDipole = false;
      }
      else {
        pMVar9 = (MultipoleAtomTypesSectionParser *)local_328;
        iVar2 = std::__cxx11::string::compare((char *)pMVar9);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare(local_328);
          __format = 
          "MultipoleAtomTypesSectionParser Error: unrecognized multiple type at line %d\n";
          if (iVar2 == 0) {
            __format = 
            "MultipoleAtomTypesSectionParser Error: \n\tsplit dipole quadrupoles (type sq) have been deprecated (line: %d)\n"
            ;
          }
          goto LAB_001eaaec;
        }
        parseDipole(pMVar9,&local_250,&local_350,lineNo);
        isDipole = true;
        parseQuadrupole(pMVar9,&local_250,&local_308,lineNo);
        isQuadrupole = true;
      }
    }
  }
  if (isDipole != false) {
    pdVar3 = local_108;
    local_108[6] = 0.0;
    local_108[7] = 0.0;
    local_108[4] = 0.0;
    local_108[5] = 0.0;
    local_108[2] = 0.0;
    local_108[3] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_108[8] = 0.0;
    psVar4 = &local_2e8;
    lVar8 = 0;
    do {
      lVar10 = 0;
      pdVar5 = pdVar3;
      do {
        *pdVar5 = (double)(&psVar4->_M_dataplus)[lVar10]._M_p;
        lVar10 = lVar10 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + 1;
      psVar4 = (string *)((psVar4->field_2)._M_local_buf + 8);
    } while (lVar8 != 3);
    pdVar3 = local_1a8;
    local_1a8[6] = 0.0;
    local_1a8[7] = 0.0;
    local_1a8[4] = 0.0;
    local_1a8[5] = 0.0;
    local_1a8[2] = 0.0;
    local_1a8[3] = 0.0;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[8] = 0.0;
    pdVar5 = local_108;
    lVar8 = 0;
    do {
      lVar10 = 0;
      do {
        pdVar3[lVar10] = pdVar5[lVar10] * local_350;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + 3;
      pdVar5 = pdVar5 + 3;
    } while (lVar8 != 3);
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    pdVar3 = local_1a8;
    lVar8 = 0;
    do {
      dVar13 = local_b8[lVar8];
      lVar10 = 0;
      do {
        dVar13 = dVar13 + *(double *)((long)pdVar3 + lVar10) *
                          *(double *)((long)&OpenMD::V3Z + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      local_b8[lVar8] = dVar13;
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + 3;
    } while (lVar8 != 3);
    local_288 = local_b8[2];
    local_298 = local_b8[0];
    dStack_290 = local_b8[1];
  }
  if (isQuadrupole != false) {
    local_1f8[0] = local_308.super_Vector<double,_3U>.data_[0];
    local_1f8[4] = local_308.super_Vector<double,_3U>.data_[1];
    local_1f8[8] = local_308.super_Vector<double,_3U>.data_[2];
    pdVar3 = local_b8;
    local_b8[6] = 0.0;
    local_b8[7] = 0.0;
    local_b8[4] = 0.0;
    local_b8[5] = 0.0;
    local_b8[2] = 0.0;
    local_b8[3] = 0.0;
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[8] = 0.0;
    lVar8 = 0;
    do {
      lVar10 = 0;
      pdVar5 = pdVar3;
      do {
        *pdVar5 = (double)(&psVar6->_M_dataplus)[lVar10]._M_p;
        lVar10 = lVar10 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + 1;
      psVar6 = (string *)((psVar6->field_2)._M_local_buf + 8);
    } while (lVar8 != 3);
    local_108[6] = 0.0;
    local_108[7] = 0.0;
    local_108[4] = 0.0;
    local_108[5] = 0.0;
    local_108[2] = 0.0;
    local_108[3] = 0.0;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_108[8] = 0.0;
    pdVar3 = local_b8;
    lVar8 = 0;
    do {
      lVar10 = 0;
      pdVar5 = local_1f8;
      do {
        dVar13 = local_108[lVar8 * 3 + lVar10];
        lVar7 = 0;
        pdVar11 = pdVar5;
        do {
          dVar13 = dVar13 + pdVar3[lVar7] * *pdVar11;
          lVar7 = lVar7 + 1;
          pdVar11 = pdVar11 + 3;
        } while (lVar7 != 3);
        local_108[lVar8 * 3 + lVar10] = dVar13;
        lVar10 = lVar10 + 1;
        pdVar5 = pdVar5 + 1;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + 3;
    } while (lVar8 != 3);
    local_1a8[6] = 0.0;
    local_1a8[7] = 0.0;
    local_1a8[4] = 0.0;
    local_1a8[5] = 0.0;
    local_1a8[2] = 0.0;
    local_1a8[3] = 0.0;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[8] = 0.0;
    pdVar3 = local_108;
    lVar8 = 0;
    do {
      lVar10 = 0;
      psVar6 = &local_2e8;
      do {
        dVar13 = local_1a8[lVar8 * 3 + lVar10];
        lVar7 = 0;
        psVar4 = psVar6;
        do {
          dVar13 = dVar13 + pdVar3[lVar7] * (double)(psVar4->_M_dataplus)._M_p;
          lVar7 = lVar7 + 1;
          psVar4 = (string *)((psVar4->field_2)._M_local_buf + 8);
        } while (lVar7 != 3);
        local_1a8[lVar8 * 3 + lVar10] = dVar13;
        lVar10 = lVar10 + 1;
        psVar6 = (string *)&psVar6->_M_string_length;
      } while (lVar10 != 3);
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + 3;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      *(undefined8 *)((long)local_1f8 + lVar8 + 0x10) =
           *(undefined8 *)((long)local_1a8 + lVar8 + 0x10);
      uVar1 = *(undefined8 *)((long)local_1a8 + lVar8 + 8);
      *(undefined8 *)((long)local_1f8 + lVar8) = *(undefined8 *)((long)local_1a8 + lVar8);
      *(undefined8 *)((long)local_1f8 + lVar8 + 8) = uVar1;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x48);
  }
  local_128.super_Vector<double,_3U>.data_[2] = local_288;
  local_128.super_Vector<double,_3U>.data_[0] = local_298;
  local_128.super_Vector<double,_3U>.data_[1] = dStack_290;
  lVar8 = 0;
  do {
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar8 + 0x10) = *(undefined8 *)((long)local_1f8 + lVar8 + 0x10);
    uVar1 = *(undefined8 *)((long)local_1f8 + lVar8 + 8);
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar8
     ) = *(undefined8 *)((long)local_1f8 + lVar8);
    *(undefined8 *)
     ((long)local_70.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar8 + 8) = uVar1;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  MultipoleAdapter::makeMultipole(&local_278,&local_128,&local_70,isDipole,isQuadrupole);
  if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
LAB_001eaf5a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.delim_._M_dataplus._M_p != &local_250.delim_.field_2) {
    operator_delete(local_250.delim_._M_dataplus._M_p,
                    local_250.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.tokenString_._M_dataplus._M_p != &local_250.tokenString_.field_2) {
    operator_delete(local_250.tokenString_._M_dataplus._M_p,
                    local_250.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseLine(ForceField& ff,
                                                  const std::string& line,
                                                  int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // name multipole_type theta phi psi
    // "name" must match the name in the AtomTypes section
    //
    // avaliable multipole types are:
    // d  (dipole)
    // q  (quadrupole)
    // dq (dipole plus quadrupole)
    //
    // Directionality for dipoles and quadrupoles is given by three
    // euler angles (phi, theta, psi), because the body-fixed
    // reference frame for directional atoms is determined by the
    // *mass* distribution and not by the charge distribution.
    //
    // Dipoles are given in units of Debye
    // Quadrupoles are given in units of esu centibarn
    //
    // Examples:
    //
    // name d phi theta psi dipole_moment
    // name q phi theta psi Qxx Qyy Qzz
    // name dq phi theta psi dipole_moment Qxx Qyy Qzz

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName  = tokenizer.nextToken();
      std::string multipoleType = tokenizer.nextToken();
      RealType phi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType theta = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType psi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: Can not find matched "
                 "AtomType[%s] "
                 "at line %d\n",
                 atomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      MultipoleAdapter ma = MultipoleAdapter(atomType);

      RotMat3x3d eFrame(0.0);

      eFrame.setupRotMat(phi, theta, psi);

      RealType dipoleMoment(0);
      Vector3d dipole(V3Zero);
      Vector3d quadrupoleMoments(V3Zero);
      Mat3x3d quadrupole(0.0);

      bool isDipole(false);
      bool isQuadrupole(false);

      if (multipoleType == "d") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
      } else if (multipoleType == "s") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipoles (type s) have been deprecated (line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else if (multipoleType == "q") {
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "dq") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "sq") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipole quadrupoles (type sq) have been deprecated "
                 "(line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: unrecognized multiple "
                 "type at line "
                 "%d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
      if (isDipole) dipole = dipoleMoment * eFrame.transpose() * V3Z;
      if (isQuadrupole) {
        quadrupole(0, 0) = quadrupoleMoments(0);
        quadrupole(1, 1) = quadrupoleMoments(1);
        quadrupole(2, 2) = quadrupoleMoments(2);
        quadrupole       = eFrame.transpose() * quadrupole * eFrame;
      }

      ma.makeMultipole(dipole, quadrupole, isDipole, isQuadrupole);
    }
  }